

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::SetPeriodicGrevilleKnotVector(ON_NurbsSurface *this,int dir,int g_stride,double *g)

{
  bool bVar1;
  int iVar2;
  int cv_count;
  double *g_local;
  int g_stride_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (((this->m_knot[dir] == (double *)0x0) && (1 < this->m_order[dir])) &&
     (this->m_order[dir] <= this->m_cv_count[dir])) {
    iVar2 = KnotCount(this,dir);
    ReserveKnotCapacity(this,dir,iVar2);
  }
  iVar2 = Order(this,dir);
  cv_count = CVCount(this,dir);
  bVar1 = ON_GetGrevilleKnotVector(g_stride,g,true,iVar2,cv_count,this->m_knot[dir]);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::SetPeriodicGrevilleKnotVector(
         int dir,        // dir
         int g_stride,   // g_stride
         const double* g // g[], Greville abcissa
         )
{
  DestroySurfaceTree();
  if ( !m_knot[dir] && m_order[dir] >= 2 && m_cv_count[dir] >= m_order[dir] )
    ReserveKnotCapacity(dir,KnotCount(dir));
  return ON_GetGrevilleKnotVector( g_stride, g, true, Order(dir), CVCount(dir), m_knot[dir] );
}